

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_gemv_square_LDSame<std::complex<double>,std::complex<double>,(char)67>(void)

{
  complex<double> BETA_00;
  complex<double> ALPHA_00;
  bool bVar1;
  quaternion<double> *Y_00;
  ostream *poVar2;
  ostream *poVar3;
  reference pvVar4;
  reference __q;
  reference __x;
  quaternion<double> *in_XMM0_Qa;
  quaternion<double> *in_XMM1_Qa;
  quaternion<double> tmp;
  int32_t AStride;
  int32_t ACOL;
  int32_t AROW;
  int i;
  stringstream ss;
  complex<double> BETA;
  complex<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffff988;
  undefined4 uVar5;
  undefined1 pv_;
  quaternion<double> *__y;
  uniform_real_distribution<double> *in_stack_fffffffffffff990;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff99c;
  allocator_type *in_stack_fffffffffffff9a0;
  size_type in_stack_fffffffffffff9a8;
  quaternion<double> *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  int32_t LDA;
  undefined8 uVar7;
  quaternion<double> *in_stack_fffffffffffff9c0;
  int32_t in_stack_fffffffffffff9cc;
  size_type __n;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9d8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9e0;
  int32_t INCX;
  basic_cstring<const_char> local_548;
  basic_cstring<const_char> local_538;
  undefined1 local_528 [32];
  undefined8 local_508;
  undefined1 local_440 [24];
  undefined1 local_428 [16];
  basic_cstring<const_char> local_418;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  quaternion<double> local_3c8;
  undefined4 local_3a8;
  int iVar8;
  int INCY;
  int iVar9;
  quaternion<double> *pqVar10;
  quaternion<double> *X_00;
  quaternion<double> *pqVar11;
  string local_370 [32];
  stringstream local_350 [16];
  ostream local_340 [376];
  quaternion<double> *local_1c8;
  quaternion<double> *pqStack_1c0;
  quaternion<double> *local_1b8 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  quaternion<double> *local_190;
  result_type_conflict1 local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  quaternion<double> *local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  quaternion<double> *local_d0;
  result_type_conflict1 local_c8;
  result_type_conflict1 local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ebddc);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ebe05);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ebe1a);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ebe43);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ebe58);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ebe81);
  local_78 = local_48;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff988);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff988);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff990,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff988);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_c0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_c8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    in_XMM0_Qa = (quaternion<double> *)
                 std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_d0 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion
              (&local_b0,&local_b8,&local_c0,&local_c8,(double *)&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = &local_68;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff988);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff988);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff990,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff988);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_120 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_128 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    in_XMM0_Qa = (quaternion<double> *)
                 std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_130 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion
              (&local_110,&local_118,&local_120,&local_128,(double *)&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_18;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff988);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffff988);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff990,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff988);
    LDA = (int32_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_180 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_188 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    in_XMM0_Qa = (quaternion<double> *)
                 std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    local_190 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion
              (&local_170,&local_178,&local_180,&local_188,(double *)&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffff988 >> 0x20);
  genRandom<std::complex<double>>();
  local_1b8[0] = in_XMM0_Qa;
  genRandom<std::complex<double>>();
  local_1c8 = in_XMM1_Qa;
  pqStack_1c0 = in_XMM0_Qa;
  std::__cxx11::stringstream::stringstream(local_350);
  Y_00 = (quaternion<double> *)std::operator<<(local_340,"hblas2_gemv_square_");
  std::operator<<((ostream *)Y_00,'C');
  std::operator<<(local_340,"C");
  std::operator<<(local_340,"C");
  std::operator<<(local_340,"_LDSame");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&std::cout,local_370);
  poVar3 = std::operator<<(poVar2," will use");
  INCX = (int32_t)poVar2;
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_370);
  poVar2 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  poVar2 = std::operator<<(poVar2,(complex *)local_1b8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  poVar3 = std::operator<<(poVar2,(complex *)&local_1c8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __n = 0;
  pqVar11 = local_1b8[0];
  pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_18,0);
  __q = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](local_48,__n);
  X_00 = pqStack_1c0;
  __x = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_68,__n);
  uVar6 = 1;
  __y = (quaternion<double> *)CONCAT44(uVar5,1);
  ALPHA_00._M_value._8_8_ = poVar2;
  ALPHA_00._M_value._0_8_ = poVar3;
  BETA_00._M_value._8_8_ = __q;
  BETA_00._M_value._0_8_ = pvVar4;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,std::complex<double>>
            ((char)(__n >> 0x38),(int32_t)__n,in_stack_fffffffffffff9cc,ALPHA_00,
             in_stack_fffffffffffff9c0,LDA,in_stack_fffffffffffff9b0,INCX,BETA_00,Y_00,
             (int32_t)in_XMM0_Qa);
  INCY = 0;
  pqVar10 = local_1c8;
  while (INCY < 100) {
    iVar8 = 0;
    local_3a8 = 1;
    local_3d0 = 0.0;
    local_3d8 = 0.0;
    local_3e0 = 0.0;
    local_3e8 = 0.0;
    iVar9 = INCY;
    HAXX::quaternion<double>::quaternion(&local_3c8,&local_3d0,&local_3d8,&local_3e0,&local_3e8);
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (&local_18,(long)(iVar8 + INCY * 100));
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_48,0);
    HAXX::HBLAS_DOTCV<double>
              ((int32_t)((ulong)pqVar11 >> 0x20),X_00,(int32_t)((ulong)pqVar10 >> 0x20),
               (quaternion<double> *)CONCAT44(iVar9,iVar8),INCY);
    local_3c8._M_real = local_408;
    local_3c8._M_imag_i = local_400;
    local_3c8._M_imag_j = local_3f8;
    local_3c8._M_imag_k = local_3f0;
    do {
      uVar7 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)__x);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar7,&local_418,0x47,local_428);
      HAXX::operator*((complex<double> *)in_XMM0_Qa,Y_00);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_1a8,(long)iVar9);
      HAXX::operator*((complex<double> *)in_XMM0_Qa,Y_00);
      HAXX::operator+(__x,__y);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_68,(long)iVar9);
      HAXX::inv<double>(__q);
      HAXX::operator*(in_XMM1_Qa,in_XMM0_Qa);
      local_508 = 0x3ff0000000000000;
      HAXX::operator-(__x,&__y->_M_real);
      pv_ = (undefined1)((ulong)__y >> 0x38);
      in_stack_fffffffffffff9b0 =
           (quaternion<double> *)HAXX::norm<double>(in_stack_fffffffffffff9b0);
      boost::test_tools::assertion_result::assertion_result((assertion_result *)__x,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_538,
                 "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )",0x48);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff99c,uVar6),
                 (basic_cstring<const_char> *)__x);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_548,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      __y = (quaternion<double> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_440,local_528,&local_548,0x47,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1eca36);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1eca43);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    INCY = iVar9 + 1;
  }
  std::__cxx11::stringstream::~stringstream(local_350);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9a0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9a0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9a0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9a0);
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}